

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<args::Command_*,_std::allocator<args::Command_*>_> * __thiscall
args::Group::GetCommands
          (vector<args::Command_*,_std::allocator<args::Command_*>_> *__return_storage_ptr__,
          Group *this)

{
  bool bVar1;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<args::Command_**,_std::vector<args::Command_*,_std::allocator<args::Command_*>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_58 [8];
  vector<args::Command_*,_std::allocator<args::Command_*>_> subparsers;
  Base **child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  Group *this_local;
  vector<args::Command_*,_std::allocator<args::Command_*>_> *res;
  
  std::vector<args::Command_*,_std::allocator<args::Command_*>_>::vector(__return_storage_ptr__);
  this_00 = Children(this);
  __end2 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_00);
  child = (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                     *)&child), bVar1) {
    subparsers.super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                  ::operator*(&__end2);
    (*((*subparsers.super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->super_Group).super_Base._vptr_Base[5])
              (local_58);
    local_78._M_current =
         (Command **)
         std::end<std::vector<args::Command*,std::allocator<args::Command*>>>
                   (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<args::Command*const*,std::vector<args::Command*,std::allocator<args::Command*>>>
    ::__normal_iterator<args::Command**>
              ((__normal_iterator<args::Command*const*,std::vector<args::Command*,std::allocator<args::Command*>>>
                *)&local_70,&local_78);
    __first = std::begin<std::vector<args::Command*,std::allocator<args::Command*>>>
                        ((vector<args::Command_*,_std::allocator<args::Command_*>_> *)local_58);
    __last = std::end<std::vector<args::Command*,std::allocator<args::Command*>>>
                       ((vector<args::Command_*,_std::allocator<args::Command_*>_> *)local_58);
    std::vector<args::Command*,std::allocator<args::Command*>>::
    insert<__gnu_cxx::__normal_iterator<args::Command**,std::vector<args::Command*,std::allocator<args::Command*>>>,void>
              ((vector<args::Command*,std::allocator<args::Command*>> *)__return_storage_ptr__,
               local_70,(__normal_iterator<args::Command_**,_std::vector<args::Command_*,_std::allocator<args::Command_*>_>_>
                         )__first._M_current,
               (__normal_iterator<args::Command_**,_std::vector<args::Command_*,_std::allocator<args::Command_*>_>_>
                )__last._M_current);
    std::vector<args::Command_*,_std::allocator<args::Command_*>_>::~vector
              ((vector<args::Command_*,_std::allocator<args::Command_*>_> *)local_58);
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<Command*> GetCommands() override
            {
                std::vector<Command*> res;
                for (const auto &child : Children())
                {
                    auto subparsers = child->GetCommands();
                    res.insert(std::end(res), std::begin(subparsers), std::end(subparsers));
                }
                return res;
            }